

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O0

aom_codec_cx_pkt_t * aom_codec_pkt_list_get(aom_codec_pkt_list *list,aom_codec_iter_t *iter)

{
  aom_codec_cx_pkt_t *pkt;
  aom_codec_iter_t *iter_local;
  aom_codec_pkt_list *list_local;
  
  if (*iter == (aom_codec_iter_t)0x0) {
    *iter = list->pkts;
  }
  pkt = (aom_codec_cx_pkt_t *)*iter;
  if ((ulong)(((long)pkt - (long)list->pkts) / 0xa8) < (ulong)list->cnt) {
    *iter = pkt + 1;
  }
  else {
    pkt = (aom_codec_cx_pkt_t *)0x0;
  }
  return pkt;
}

Assistant:

const aom_codec_cx_pkt_t *aom_codec_pkt_list_get(
    struct aom_codec_pkt_list *list, aom_codec_iter_t *iter) {
  const aom_codec_cx_pkt_t *pkt;

  if (!(*iter)) {
    *iter = list->pkts;
  }

  pkt = (const aom_codec_cx_pkt_t *)*iter;

  if ((size_t)(pkt - list->pkts) < list->cnt)
    *iter = pkt + 1;
  else
    pkt = NULL;

  return pkt;
}